

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# string-tree.h
# Opt level: O1

void __thiscall
kj::StringTree::
fill<kj::ArrayPtr<char_const>,kj::String,kj::ArrayPtr<char_const>,kj::ArrayPtr<char_const>,kj::ArrayPtr<char_const>,kj::CappedArray<char,8ul>,kj::ArrayPtr<char_const>>
          (StringTree *this,char *pos,size_t branchIndex,String *first,ArrayPtr<const_char> *rest,
          String *rest_1,ArrayPtr<const_char> *rest_2,ArrayPtr<const_char> *rest_3,
          ArrayPtr<const_char> *rest_4,CappedArray<char,_8UL> *rest_5,ArrayPtr<const_char> *rest_6)

{
  Branch *pBVar1;
  char *pcVar2;
  size_t sVar3;
  ArrayDisposer *pAVar4;
  Branch *pBVar5;
  size_t __n;
  char *pcVar6;
  size_t sVar7;
  long lVar8;
  size_t sVar9;
  undefined8 uVar10;
  ArrayDisposer *pAVar11;
  Branch *pBVar12;
  size_t sVar13;
  
  pcVar6 = (char *)(this->text).content.size_;
  if (pcVar6 != (char *)0x0) {
    pcVar6 = (this->text).content.ptr;
  }
  (this->branches).ptr[branchIndex].index = (long)pos - (long)pcVar6;
  sVar9 = (first->content).size_;
  sVar7 = 0;
  if (sVar9 != 0) {
    sVar7 = sVar9 - 1;
  }
  pcVar6 = (first->content).ptr;
  pAVar11 = (first->content).disposer;
  (first->content).ptr = (char *)0x0;
  (first->content).size_ = 0;
  pBVar12 = (Branch *)0x0;
  sVar13 = 0;
  pBVar1 = (this->branches).ptr;
  pBVar1[branchIndex].content.size_ = sVar7;
  pcVar2 = pBVar1[branchIndex].content.text.content.ptr;
  if (pcVar2 != (char *)0x0) {
    sVar3 = pBVar1[branchIndex].content.text.content.size_;
    pBVar1[branchIndex].content.text.content.ptr = (char *)0x0;
    pBVar1[branchIndex].content.text.content.size_ = 0;
    pAVar4 = pBVar1[branchIndex].content.text.content.disposer;
    (**pAVar4->_vptr_ArrayDisposer)(pAVar4,pcVar2,1,sVar3,sVar3,0);
  }
  pBVar1[branchIndex].content.text.content.ptr = pcVar6;
  pBVar1[branchIndex].content.text.content.size_ = sVar9;
  pBVar1[branchIndex].content.text.content.disposer = pAVar11;
  lVar8 = 0;
  uVar10 = 0;
  pBVar5 = pBVar1[branchIndex].content.branches.ptr;
  if (pBVar5 != (Branch *)0x0) {
    sVar9 = pBVar1[branchIndex].content.branches.size_;
    pBVar1[branchIndex].content.branches.ptr = (Branch *)0x0;
    pBVar1[branchIndex].content.branches.size_ = 0;
    pAVar4 = pBVar1[branchIndex].content.branches.disposer;
    (**pAVar4->_vptr_ArrayDisposer)
              (pAVar4,pBVar5,0x40,sVar9,sVar9,
               ArrayDisposer::Dispose_<kj::StringTree::Branch,_false>::destruct);
  }
  pBVar1[branchIndex].content.branches.ptr = pBVar12;
  pBVar1[branchIndex].content.branches.size_ = sVar13;
  pBVar1[branchIndex].content.branches.disposer = (ArrayDisposer *)0x0;
  if (lVar8 != 0) {
    (**pAVar11->_vptr_ArrayDisposer)
              (pAVar11,lVar8,1,uVar10,uVar10,0,rest_1,rest,sVar7,0,0,pAVar11,0,0);
  }
  __n = rest->size_;
  if (__n != 0) {
    memcpy(pos,rest->ptr,__n);
    pos = pos + __n;
  }
  fill<kj::ArrayPtr<char_const>,kj::ArrayPtr<char_const>,kj::ArrayPtr<char_const>,kj::CappedArray<char,8ul>,kj::ArrayPtr<char_const>>
            (this,pos,branchIndex + 1,rest_1,rest_2,rest_3,rest_4,rest_5,rest_6);
  return;
}

Assistant:

void StringTree::fill(char* pos, size_t branchIndex, String&& first, Rest&&... rest) {
  branches[branchIndex].index = pos - text.begin();
  branches[branchIndex].content = StringTree(kj::mv(first));
  fill(pos, branchIndex + 1, kj::fwd<Rest>(rest)...);
}